

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_AddIntrinsicBaseObjects(JSContext *ctx)

{
  JSValue *pJVar1;
  char cVar2;
  JSRefCountHeader *p;
  size_t sVar3;
  JSCFunctionListEntry *__s;
  int argc;
  JSCFunctionListEntry *prop;
  int64_t extraout_RDX;
  int64_t iVar4;
  char *pcVar5;
  JSValueUnion JVar6;
  char *pcVar7;
  JSRefCountHeader *p_3;
  long lVar8;
  int magic;
  JSAtom atom;
  char *pcVar9;
  byte bVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue proto;
  JSValue val;
  JSValueUnion local_98;
  char unscopables [74];
  
  bVar10 = 0;
  magic = 0;
  JVar11 = JS_NewCFunction(ctx,js_throw_type_error,(char *)0x0,0);
  ctx->throw_type_error = JVar11;
  JVar11 = JS_NewCFunction(ctx,js_function_proto_caller,(char *)0x0,0);
  local_98 = JVar11.u;
  JS_DefineProperty(ctx,ctx->function_proto,0x4f,(JSValue)(ZEXT816(3) << 0x40),JVar11,
                    ctx->throw_type_error,0x1901);
  argc = 0x4d;
  JS_DefineProperty(ctx,ctx->function_proto,0x4d,(JSValue)(ZEXT816(3) << 0x40),JVar11,
                    ctx->throw_type_error,0x1901);
  JS_FreeValue(ctx,JVar11);
  JVar11.tag = extraout_RDX;
  JVar11.u.float64 = local_98.float64;
  JVar11 = js_object_seal(ctx,JVar11,argc,&ctx->throw_type_error,1);
  JS_FreeValue(ctx,JVar11);
  JVar11 = JS_NewObject(ctx);
  ctx->global_obj = JVar11;
  JVar11 = JS_NewObjectProto(ctx,(JSValue)(ZEXT816(2) << 0x40));
  ctx->global_var_obj = JVar11;
  JVar11 = JS_NewGlobalCConstructor(ctx,"Object",js_object_constructor,1,ctx->class_proto[1]);
  JS_SetPropertyFunctionList(ctx,JVar11,js_object_funcs,0x16);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[1],js_object_proto_funcs,0xb);
  JS_SetPropertyFunctionList(ctx,ctx->function_proto,js_function_proto_funcs,7);
  JVar11 = JS_NewCFunction2(ctx,js_function_constructor,"Function",1,
                            JS_CFUNC_constructor_or_func_magic,0);
  ctx->function_ctor = JVar11;
  if (0xfffffff4 < (uint)JVar11.tag) {
    *(int *)JVar11.u.ptr = *JVar11.u.ptr + 1;
  }
  JS_NewGlobalCConstructor2(ctx,JVar11,"Function",ctx->function_proto);
  JVar11 = JS_NewCFunction2(ctx,js_error_constructor,"Error",1,JS_CFUNC_constructor_or_func_magic,-1
                           );
  JS_NewGlobalCConstructor2(ctx,JVar11,"Error",ctx->class_proto[3]);
  for (lVar8 = -0x40; lVar8 != 0; lVar8 = lVar8 + 8) {
    pcVar9 = *(char **)((long)&js_iterator_proto_funcs[0].name + lVar8);
    JVar12 = JS_NewCFunction3(ctx,js_error_constructor,pcVar9,(lVar8 == -8) + 1,
                              JS_CFUNC_constructor_or_func_magic,magic,JVar11);
    proto.tag = *(int64_t *)((long)&(ctx->iterator_proto).tag + lVar8 * 2);
    proto.u.ptr = ((JSValueUnion *)((long)&ctx->native_error_proto[8].u + lVar8 * 2))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar12,pcVar9,proto);
    magic = magic + 1;
  }
  JVar11 = JS_NewObject(ctx);
  ctx->iterator_proto = JVar11;
  JS_SetPropertyFunctionList(ctx,JVar11,js_iterator_proto_funcs,1);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[2],js_array_proto_funcs,0x20);
  JVar11 = JS_NewGlobalCConstructor(ctx,"Array",js_array_constructor,1,ctx->class_proto[2]);
  if (0xfffffff4 < (uint)JVar11.tag) {
    *(int *)JVar11.u.ptr = *JVar11.u.ptr + 1;
  }
  ctx->array_ctor = JVar11;
  JS_SetPropertyFunctionList(ctx,JVar11,js_array_funcs,4);
  pcVar9 = unscopables;
  pcVar5 = "copyWithin";
  pcVar7 = pcVar9;
  for (lVar8 = 0x4a; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar7 = *pcVar5;
    pcVar5 = pcVar5 + (ulong)bVar10 * -2 + 1;
    pcVar7 = pcVar7 + (ulong)bVar10 * -2 + 1;
  }
  JVar11 = JS_NewObjectProto(ctx,(JSValue)(ZEXT816(2) << 0x40));
  cVar2 = 'c';
  while (cVar2 != '\0') {
    val.tag = 1;
    val.u.float64 = 4.94065645841247e-324;
    JS_DefinePropertyValueStr(ctx,JVar11,pcVar9,val,7);
    sVar3 = strlen(pcVar9);
    pcVar9 = pcVar9 + sVar3 + 1;
    cVar2 = *pcVar9;
  }
  JS_DefinePropertyValue(ctx,ctx->class_proto[2],0xd0,JVar11,1);
  JVar11 = JS_GetPropertyInternal(ctx,ctx->class_proto[2],0x6b,ctx->class_proto[2],0);
  ctx->array_proto_values = JVar11;
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProto(ctx,ctx->iterator_proto);
  pJVar1[0x25] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x25],js_array_iterator_proto_funcs,2);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_global_funcs,0xe);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar1[1],4);
  pJVar1[4] = JVar11;
  JS_SetObjectData(ctx,ctx->class_proto[4],(JSValue)ZEXT816(0));
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[4],js_number_proto_funcs,6);
  JVar11 = JS_NewGlobalCConstructor(ctx,"Number",js_number_constructor,1,ctx->class_proto[4]);
  JS_SetPropertyFunctionList(ctx,JVar11,js_number_funcs,0xe);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar1[1],6);
  pJVar1[6] = JVar11;
  JS_SetObjectData(ctx,ctx->class_proto[6],(JSValue)(ZEXT816(1) << 0x40));
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[6],js_boolean_proto_funcs,2);
  JS_NewGlobalCConstructor(ctx,"Boolean",js_boolean_constructor,1,ctx->class_proto[6]);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar1[1],5);
  pJVar1[5] = JVar11;
  pJVar1 = ctx->class_proto;
  JVar11 = JS_AtomToString(ctx,0x2f);
  JS_SetObjectData(ctx,pJVar1[5],JVar11);
  JVar11 = JS_NewGlobalCConstructor(ctx,"String",js_string_constructor,1,ctx->class_proto[5]);
  JS_SetPropertyFunctionList(ctx,JVar11,js_string_funcs,3);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[5],js_string_proto_funcs,0x31);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProto(ctx,ctx->iterator_proto);
  pJVar1[0x26] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x26],js_string_iterator_proto_funcs,2);
  gettimeofday((timeval *)unscopables,(__timezone_ptr_t)0x0);
  ctx->random_state =
       unscopables._0_8_ * 1000000 + unscopables._8_8_ +
       (ulong)(unscopables._0_8_ * 1000000 + unscopables._8_8_ == 0);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_math_obj,1);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_reflect_obj,1);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObject(ctx);
  pJVar1[7] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[7],js_symbol_proto_funcs,5);
  JVar11 = JS_NewGlobalCConstructor(ctx,"Symbol",js_symbol_constructor,0,ctx->class_proto[7]);
  prop = js_symbol_funcs;
  JS_SetPropertyFunctionList(ctx,JVar11,js_symbol_funcs,2);
  for (atom = 0xc5; atom != 0xd2; atom = atom + 1) {
    __s = (JSCFunctionListEntry *)JS_AtomGetStr(ctx,unscopables,atom,(JSAtom)prop);
    pcVar9 = strchr((char *)__s,0x2e);
    prop = (JSCFunctionListEntry *)(pcVar9 + 1);
    if (pcVar9 == (char *)0x0) {
      prop = __s;
    }
    JVar12 = JS_AtomToValue(ctx,atom);
    JS_DefinePropertyValueStr(ctx,JVar11,(char *)prop,JVar12,0);
  }
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProto(ctx,ctx->iterator_proto);
  pJVar1[0x28] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x28],js_generator_proto_funcs,4);
  pJVar1 = ctx->class_proto;
  JVar11 = JS_NewObjectProto(ctx,ctx->function_proto);
  pJVar1[0x10] = JVar11;
  JVar11 = JS_NewCFunction2(ctx,js_function_constructor,"GeneratorFunction",1,
                            JS_CFUNC_constructor_or_func_magic,1);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x10],js_generator_function_proto_funcs,1);
  JS_SetConstructor2(ctx,ctx->class_proto[0x10],ctx->class_proto[0x28],1,1);
  JS_SetConstructor2(ctx,JVar11,ctx->class_proto[0x10],0,1);
  JS_FreeValue(ctx,JVar11);
  JVar11 = JS_NewCFunction(ctx,js_global_eval,"eval",1);
  ctx->eval_obj = JVar11;
  if (0xfffffff4 < (uint)JVar11.tag) {
    *(int *)JVar11.u.ptr = *JVar11.u.ptr + 1;
  }
  JS_DefinePropertyValue(ctx,ctx->global_obj,0x3a,JVar11,3);
  JVar6 = (JSValueUnion)(ctx->global_obj).u.ptr;
  iVar4 = (ctx->global_obj).tag;
  JVar11 = ctx->global_obj;
  if (0xfffffff4 < (uint)iVar4) {
    *(int *)JVar6.ptr = *JVar6.ptr + 1;
    JVar6 = (JSValueUnion)(ctx->global_obj).u.ptr;
    iVar4 = (ctx->global_obj).tag;
  }
  JVar12.tag = iVar4;
  JVar12.u.ptr = JVar6.ptr;
  JS_DefinePropertyValue(ctx,JVar12,0x8a,JVar11,3);
  return;
}

Assistant:

void JS_AddIntrinsicBaseObjects(JSContext *ctx)
{
    int i;
    JSValueConst obj, number_obj;
    JSValue obj1;

    ctx->throw_type_error = JS_NewCFunction(ctx, js_throw_type_error, NULL, 0);

    /* add caller and arguments properties to throw a TypeError */
    obj1 = JS_NewCFunction(ctx, js_function_proto_caller, NULL, 0);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_caller, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_arguments, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);
    JS_FreeValue(ctx, js_object_seal(ctx, JS_UNDEFINED, 1, (JSValueConst *)&ctx->throw_type_error, 1));

    ctx->global_obj = JS_NewObject(ctx);
    ctx->global_var_obj = JS_NewObjectProto(ctx, JS_NULL);

    /* Object */
    obj = JS_NewGlobalCConstructor(ctx, "Object", js_object_constructor, 1,
                                   ctx->class_proto[JS_CLASS_OBJECT]);
    JS_SetPropertyFunctionList(ctx, obj, js_object_funcs, countof(js_object_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                               js_object_proto_funcs, countof(js_object_proto_funcs));

    /* Function */
    JS_SetPropertyFunctionList(ctx, ctx->function_proto, js_function_proto_funcs, countof(js_function_proto_funcs));
    ctx->function_ctor = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                              "Function", 1, JS_CFUNC_constructor_or_func_magic,
                                              JS_FUNC_NORMAL);
    JS_NewGlobalCConstructor2(ctx, JS_DupValue(ctx, ctx->function_ctor), "Function",
                              ctx->function_proto);

    /* Error */
    obj1 = JS_NewCFunctionMagic(ctx, js_error_constructor,
                                "Error", 1, JS_CFUNC_constructor_or_func_magic, -1);
    JS_NewGlobalCConstructor2(ctx, obj1,
                              "Error", ctx->class_proto[JS_CLASS_ERROR]);

    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JSValue func_obj;
        int n_args;
        n_args = 1 + (i == JS_AGGREGATE_ERROR);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_error_constructor,
                                    native_error_name[i], n_args,
                                    JS_CFUNC_constructor_or_func_magic, i, obj1);
        JS_NewGlobalCConstructor2(ctx, func_obj, native_error_name[i],
                                  ctx->native_error_proto[i]);
    }

    /* Iterator prototype */
    ctx->iterator_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->iterator_proto,
                               js_iterator_proto_funcs,
                               countof(js_iterator_proto_funcs));

    /* Array */
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               js_array_proto_funcs,
                               countof(js_array_proto_funcs));

    obj = JS_NewGlobalCConstructor(ctx, "Array", js_array_constructor, 1,
                                   ctx->class_proto[JS_CLASS_ARRAY]);
    ctx->array_ctor = JS_DupValue(ctx, obj);
    JS_SetPropertyFunctionList(ctx, obj, js_array_funcs,
                               countof(js_array_funcs));

    /* XXX: create auto_initializer */
    {
        /* initialize Array.prototype[Symbol.unscopables] */
        char const unscopables[] = "copyWithin" "\0" "entries" "\0" "fill" "\0" "find" "\0"
            "findIndex" "\0" "flat" "\0" "flatMap" "\0" "includes" "\0" "keys" "\0" "values" "\0";
        const char *p = unscopables;
        obj1 = JS_NewObjectProto(ctx, JS_NULL);
        for(p = unscopables; *p; p += strlen(p) + 1) {
            JS_DefinePropertyValueStr(ctx, obj1, p, JS_TRUE, JS_PROP_C_W_E);
        }
        JS_DefinePropertyValue(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               JS_ATOM_Symbol_unscopables, obj1,
                               JS_PROP_CONFIGURABLE);
    }

    /* needed to initialize arguments[Symbol.iterator] */
    ctx->array_proto_values =
        JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_values);

    ctx->class_proto[JS_CLASS_ARRAY_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_ITERATOR],
                               js_array_iterator_proto_funcs,
                               countof(js_array_iterator_proto_funcs));

    /* parseFloat and parseInteger must be defined before Number
       because of the Number.parseFloat and Number.parseInteger
       aliases */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_global_funcs,
                               countof(js_global_funcs));

    /* Number */
    ctx->class_proto[JS_CLASS_NUMBER] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_NUMBER);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_NUMBER], JS_NewInt32(ctx, 0));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_NUMBER],
                               js_number_proto_funcs,
                               countof(js_number_proto_funcs));
    number_obj = JS_NewGlobalCConstructor(ctx, "Number", js_number_constructor, 1,
                                          ctx->class_proto[JS_CLASS_NUMBER]);
    JS_SetPropertyFunctionList(ctx, number_obj, js_number_funcs, countof(js_number_funcs));

    /* Boolean */
    ctx->class_proto[JS_CLASS_BOOLEAN] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                                JS_CLASS_BOOLEAN);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], JS_NewBool(ctx, FALSE));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], js_boolean_proto_funcs,
                               countof(js_boolean_proto_funcs));
    JS_NewGlobalCConstructor(ctx, "Boolean", js_boolean_constructor, 1,
                             ctx->class_proto[JS_CLASS_BOOLEAN]);

    /* String */
    ctx->class_proto[JS_CLASS_STRING] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_STRING);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_STRING], JS_AtomToString(ctx, JS_ATOM_empty_string));
    obj = JS_NewGlobalCConstructor(ctx, "String", js_string_constructor, 1,
                                   ctx->class_proto[JS_CLASS_STRING]);
    JS_SetPropertyFunctionList(ctx, obj, js_string_funcs,
                               countof(js_string_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING], js_string_proto_funcs,
                               countof(js_string_proto_funcs));

    ctx->class_proto[JS_CLASS_STRING_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING_ITERATOR],
                               js_string_iterator_proto_funcs,
                               countof(js_string_iterator_proto_funcs));

    /* Math: create as autoinit object */
    js_random_init(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_math_obj, countof(js_math_obj));

    /* ES6 Reflect: create as autoinit object */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_reflect_obj, countof(js_reflect_obj));

    /* ES6 Symbol */
    ctx->class_proto[JS_CLASS_SYMBOL] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SYMBOL], js_symbol_proto_funcs,
                               countof(js_symbol_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Symbol", js_symbol_constructor, 0,
                                   ctx->class_proto[JS_CLASS_SYMBOL]);
    JS_SetPropertyFunctionList(ctx, obj, js_symbol_funcs,
                               countof(js_symbol_funcs));
    for(i = JS_ATOM_Symbol_toPrimitive; i < JS_ATOM_END; i++) {
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *str, *p;
        str = JS_AtomGetStr(ctx, buf, sizeof(buf), i);
        /* skip "Symbol." */
        p = strchr(str, '.');
        if (p)
            str = p + 1;
        JS_DefinePropertyValueStr(ctx, obj, str, JS_AtomToValue(ctx, i), 0);
    }

    /* ES6 Generator */
    ctx->class_proto[JS_CLASS_GENERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_GENERATOR],
                               js_generator_proto_funcs,
                               countof(js_generator_proto_funcs));

    ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION] = JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                "GeneratorFunction", 1,
                                JS_CFUNC_constructor_or_func_magic, JS_FUNC_GENERATOR);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                               js_generator_function_proto_funcs,
                               countof(js_generator_function_proto_funcs));
    JS_SetConstructor2(ctx, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       ctx->class_proto[JS_CLASS_GENERATOR],
                       JS_PROP_CONFIGURABLE, JS_PROP_CONFIGURABLE);
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);

    /* global properties */
    ctx->eval_obj = JS_NewCFunction(ctx, js_global_eval, "eval", 1);
    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_eval,
                           JS_DupValue(ctx, ctx->eval_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_globalThis,
                           JS_DupValue(ctx, ctx->global_obj),
                           JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE);
}